

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

Matrix * MatrixTranspose(Matrix *a)

{
  undefined1 value [16];
  unkbyte10 Var1;
  unkbyte10 Var2;
  unkbyte10 Var3;
  unkbyte10 Var4;
  unkbyte10 Var5;
  unkbyte10 Var6;
  Matrix *a_00;
  uint32_t in_ECX;
  uint uVar7;
  Matrix *a_01;
  uint32_t rows;
  unkbyte10 in_ST0;
  unkbyte10 Var8;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 in_ST7;
  undefined6 in_stack_ffffffffffffffd2;
  
  a_00 = MatrixZero(a->columns,a->rows);
  if (a->columns != 0) {
    rows = 0;
    do {
      if (a->rows != 0) {
        a_01 = (Matrix *)0x0;
        Var8 = in_ST0;
        Var1 = in_ST1;
        Var2 = in_ST2;
        Var3 = in_ST3;
        Var4 = in_ST4;
        Var5 = in_ST5;
        Var6 = in_ST6;
        do {
          in_ST6 = in_ST7;
          in_ST5 = Var6;
          in_ST4 = Var5;
          in_ST3 = Var4;
          in_ST2 = Var3;
          in_ST1 = Var2;
          in_ST0 = Var1;
          MatrixGetElement((Real *)a,a_01,rows,in_ECX);
          value._10_6_ = in_stack_ffffffffffffffd2;
          value._0_10_ = Var8;
          in_ST7 = in_ST6;
          MatrixSetElement(a_00,rows,(uint32_t)a_01,(Real)value);
          uVar7 = (uint32_t)a_01 + 1;
          a_01 = (Matrix *)(ulong)uVar7;
          Var8 = in_ST0;
          Var1 = in_ST1;
          Var2 = in_ST2;
          Var3 = in_ST3;
          Var4 = in_ST4;
          Var5 = in_ST5;
          Var6 = in_ST6;
        } while (uVar7 < a->rows);
      }
      rows = rows + 1;
    } while (rows < a->columns);
  }
  return a_00;
}

Assistant:

Matrix *MatrixTranspose(const Matrix *a) {
  Matrix *new = MatrixZero(a->columns, a->rows);
  for (uint32_t row = 0; row < a->columns; ++row) {
    for (uint32_t col = 0; col < a->rows; ++col) {
      MatrixSetElement(new, row, col, MatrixGetElement(a, col, row));
    }
  }
  return new;
}